

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int thread_tcache_flush_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  long in_RCX;
  long in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  int ret;
  uint8_t state;
  undefined4 local_6c;
  
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    local_6c = 0xe;
  }
  else if ((in_R9 == 0) && (in_stack_00000008 == 0)) {
    if ((in_RCX == 0) && (in_R8 == 0)) {
      tcache_flush((tsd_t *)0x149e7b);
      local_6c = 0;
    }
    else {
      local_6c = 1;
    }
  }
  else {
    local_6c = 1;
  }
  return local_6c;
}

Assistant:

static int
tcache_flush_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	unsigned tcache_ind;

	WRITEONLY();
	tcache_ind = UINT_MAX;
	WRITE(tcache_ind, unsigned);
	if (tcache_ind == UINT_MAX) {
		ret = EFAULT;
		goto label_return;
	}
	tcaches_flush(tsd, tcache_ind);

	ret = 0;
label_return:
	return ret;
}